

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O1

bool __thiscall FIntermissionActionFader::ParseKey(FIntermissionActionFader *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  FadeType FT [3];
  char *local_48;
  EFadeType aEStack_40 [2];
  char *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = "FadeOut";
  uStack_30 = 1;
  local_48 = "FadeIn";
  aEStack_40[0] = FADE_In;
  aEStack_40[1] = FADE_In;
  bVar1 = FScanner::Compare(sc,"FadeType");
  if (bVar1) {
    FScanner::MustGetToken(sc,0x3d);
    FScanner::MustGetToken(sc,0x101);
    iVar2 = FScanner::MatchString(sc,&local_48,0x10);
    if (iVar2 != -1) {
      this->mFadeType = aEStack_40[(long)iVar2 * 4];
    }
    return true;
  }
  bVar1 = FIntermissionAction::ParseKey(&this->super_FIntermissionAction,sc);
  return bVar1;
}

Assistant:

bool FIntermissionActionFader::ParseKey(FScanner &sc)
{
	struct FadeType
	{
		const char *Name;
		EFadeType Type;
	}
	const FT[] = {
		{ "FadeIn", FADE_In },
		{ "FadeOut", FADE_Out },
		{ NULL, FADE_In }
	};

	if (sc.Compare("FadeType"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_Identifier);
		int v = sc.MatchString(&FT[0].Name, sizeof(FT[0]));
		if (v != -1) mFadeType = FT[v].Type;
		return true;
	}
	else return Super::ParseKey(sc);
}